

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockaction.cc
# Opt level: O1

void __thiscall
ConditionalJoin::cutDownMultiequals(ConditionalJoin *this,BlockBasic *exit,int4 in1,int4 in2)

{
  OpCode OVar1;
  PcodeOp *op;
  pointer ppVVar2;
  Varnode *pVVar3;
  Varnode *pVVar4;
  int4 slot;
  mapped_type *ppVVar5;
  int4 slot_00;
  _List_node_base *p_Var6;
  key_type local_40;
  
  slot_00 = in2;
  if (in2 < in1) {
    slot_00 = in1;
  }
  slot = in2;
  if (in1 < in2) {
    slot = in1;
  }
  p_Var6 = (exit->op).super__List_base<PcodeOp_*,_std::allocator<PcodeOp_*>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var6 != (_List_node_base *)&exit->op) {
    do {
      op = (PcodeOp *)p_Var6[1]._M_next;
      p_Var6 = p_Var6->_M_next;
      OVar1 = op->opcode->opcode;
      if (OVar1 != CPUI_COPY) {
        if (OVar1 != CPUI_MULTIEQUAL) {
          return;
        }
        ppVVar2 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pVVar3 = ppVVar2[in1];
        pVVar4 = ppVVar2[in2];
        if (pVVar3 == pVVar4) {
          Funcdata::opRemoveInput(this->data,op,slot_00);
        }
        else {
          local_40.side1 = pVVar3;
          local_40.side2 = pVVar4;
          ppVVar5 = std::
                    map<ConditionalJoin::MergePair,_Varnode_*,_std::less<ConditionalJoin::MergePair>,_std::allocator<std::pair<const_ConditionalJoin::MergePair,_Varnode_*>_>_>
                    ::operator[](&this->mergeneed,&local_40);
          pVVar3 = *ppVVar5;
          Funcdata::opRemoveInput(this->data,op,slot_00);
          Funcdata::opSetInput(this->data,op,pVVar3,slot);
        }
        if (((long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                   super__Vector_impl_data._M_start & 0x7fffffff8U) == 8) {
          Funcdata::opUninsert(this->data,op);
          Funcdata::opSetOpcode(this->data,op,CPUI_COPY);
          Funcdata::opInsertBegin(this->data,op,exit);
        }
      }
    } while (p_Var6 != (_List_node_base *)&exit->op);
  }
  return;
}

Assistant:

void ConditionalJoin::cutDownMultiequals(BlockBasic *exit,int4 in1,int4 in2)

{
  list<PcodeOp *>::const_iterator iter,enditer;

  int4 lo,hi;
  if (in1 > in2) {
    hi = in1;
    lo = in2;
  }
  else {
    hi = in2;
    lo = in1;
  }
  iter = exit->beginOp();
  enditer = exit->endOp();
  while(iter != enditer) {
    PcodeOp *op = *iter;
    ++iter;			// Advance iterator before inserts happen
    if (op->code() == CPUI_MULTIEQUAL) {
      Varnode *vn1 = op->getIn(in1);
      Varnode *vn2 = op->getIn(in2);
      if (vn1 == vn2) {
	data.opRemoveInput(op,hi);
      }
      else {
	Varnode *subvn = mergeneed[ MergePair(vn1,vn2) ];
	data.opRemoveInput(op,hi);
	data.opSetInput(op,subvn,lo);
      }
      if (op->numInput() == 1) {
	data.opUninsert(op);
	data.opSetOpcode(op,CPUI_COPY);
	data.opInsertBegin(op,exit);
      }
    }
    else if (op->code() != CPUI_COPY) break;
  }
}